

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

Frag __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Frag>::WalkInternal
          (Walker<duckdb_re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>_>
  *this_00;
  iterator *piVar1;
  ushort uVar2;
  uint uVar3;
  undefined4 uVar4;
  Regexp *pRVar5;
  undefined8 uVar6;
  undefined4 uVar10;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Frag FVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar15;
  uint32_t extraout_var_00;
  undefined4 extraout_var_01;
  uint32_t extraout_var_02;
  Frag *pFVar16;
  _Elt_pointer pWVar17;
  uint uVar18;
  undefined8 uVar19;
  long lVar20;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  Frag *pFVar21;
  bool *pbVar22;
  _Elt_pointer pWVar23;
  byte bVar24;
  uint32_t local_1c8;
  uint32_t uStack_1c4;
  uint32_t uStack_1c0;
  uint uStack_1bc;
  bool stop;
  int local_1a8;
  Frag local_1a4;
  uint32_t local_194;
  PatchList local_190;
  bool local_188;
  uint32_t local_184;
  PatchList local_180;
  bool local_178;
  Frag *local_170;
  ios_base local_138 [264];
  
  uVar19 = top_arg._8_8_;
  bVar24 = 0;
  Reset(this);
  if (re == (Regexp *)0x0) {
    _stop = (Regexp *)((ulong)_stop & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Walk NULL",9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1c8 = top_arg.begin;
    uStack_1c4 = top_arg.end.head;
    uStack_1c0 = top_arg.end.tail;
    uStack_1bc = top_arg._12_4_;
  }
  else {
    this_00 = &this->stack_;
    _stop = re;
    local_1a8 = -1;
    local_1a4.begin = (uint32_t)top_arg._0_8_;
    local_1a4.end.head = SUB84(top_arg._0_8_,4);
    local_1a4.end.tail = (uint32_t)uVar19;
    local_1a4.nullable = SUB81(uVar19,4);
    local_1a4._13_3_ = SUB83(uVar19,5);
    local_194 = 0;
    local_190.head = 0;
    local_190.tail = 0;
    local_188 = false;
    local_184 = 0;
    local_180.head = 0;
    local_180.tail = 0;
    local_178 = false;
    local_170 = (Frag *)0x0;
    pWVar17 = (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar17 ==
        (this->stack_).c.
        super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
      ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Frag>>
                ((deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
                  *)this_00,(WalkState<duckdb_re2::Frag> *)&stop);
    }
    else {
      pbVar22 = &stop;
      for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
        pWVar17->re = *(Regexp **)pbVar22;
        pbVar22 = pbVar22 + (ulong)bVar24 * -0x10 + 8;
        pWVar17 = (_Elt_pointer)((long)pWVar17 + (ulong)bVar24 * -0x10 + 8);
      }
      piVar1 = &(this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
LAB_004884bf:
    do {
      uVar3 = uStack_1bc;
      local_1c8 = 0;
      uStack_1c4 = 0;
      uStack_1c0 = 0;
      uStack_1bc = uStack_1bc & 0xffffff00;
      uVar18 = uStack_1bc;
      pWVar17 = (this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar17 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar17 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
      }
      pRVar5 = pWVar17[-1].re;
      if (pWVar17[-1].n == -1) {
        iVar13 = this->max_visits_;
        this->max_visits_ = iVar13 + -1;
        uStack_1bc._1_3_ = SUB43(uVar3,1);
        if (iVar13 < 1) {
          this->stopped_early_ = true;
          uVar19._0_4_ = pWVar17[-1].parent_arg.begin;
          uVar19._4_4_ = pWVar17[-1].parent_arg.end.head;
          local_1c8 = (*this->_vptr_Walker[5])
                                (this,pRVar5,uVar19,*(undefined8 *)&pWVar17[-1].parent_arg.end.tail)
          ;
          uStack_1c0 = (uint32_t)extraout_RDX_00;
          uStack_1bc = CONCAT31(uStack_1bc._1_3_,(char)((ulong)extraout_RDX_00 >> 0x20));
          uStack_1c4 = extraout_var_00;
        }
        else {
          _stop = (Regexp *)((ulong)_stop & 0xffffffffffffff00);
          uVar6._0_4_ = pWVar17[-1].parent_arg.begin;
          uVar6._4_4_ = pWVar17[-1].parent_arg.end.head;
          iVar13 = (*this->_vptr_Walker[2])
                             (this,pRVar5,uVar6,*(undefined8 *)&pWVar17[-1].parent_arg.end.tail,
                              &stop);
          pWVar17[-1].pre_arg.begin = iVar13;
          pWVar17[-1].pre_arg.end.head = extraout_var;
          pWVar17[-1].pre_arg.end.tail = (uint32_t)extraout_RDX;
          pWVar17[-1].pre_arg.nullable = SUB81((ulong)extraout_RDX >> 0x20,0);
          bVar12 = stop;
          if (stop == true) {
            uVar4 = pWVar17[-1].pre_arg.begin;
            uVar10 = pWVar17[-1].pre_arg.end.head;
            uVar19 = *(undefined8 *)((long)&pWVar17[-1].pre_arg.end.head + 1);
            uStack_1c0 = (uint32_t)((ulong)uVar19 >> 0x18);
            uStack_1bc._0_1_ = (undefined1)((ulong)uVar19 >> 0x38);
            local_1c8 = uVar4;
            uStack_1c4 = uVar10;
          }
          else {
            pWVar17[-1].n = 0;
            pWVar17[-1].child_args = (Frag *)0x0;
            uVar2 = pRVar5->nsub_;
            uStack_1bc = uVar18;
            if (uVar2 != 0) {
              if (uVar2 == 1) {
                pFVar16 = &pWVar17[-1].child_arg;
              }
              else {
                pFVar16 = (Frag *)operator_new__((ulong)uVar2 * 0x10);
                pFVar21 = pFVar16;
                do {
                  pFVar21->begin = 0;
                  (pFVar21->end).head = 0;
                  (pFVar21->end).tail = 0;
                  pFVar21->nullable = false;
                  pFVar21 = pFVar21 + 1;
                } while (pFVar21 != pFVar16 + uVar2);
              }
              pWVar17[-1].child_args = pFVar16;
            }
          }
          if (bVar12 == false) goto LAB_004884fb;
        }
        goto LAB_00488763;
      }
LAB_004884fb:
      uVar2 = pRVar5->nsub_;
      if (uVar2 == 0) break;
      if (uVar2 == 1) {
        paVar15 = &pRVar5->field_5;
      }
      else {
        paVar15 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar5->field_5).submany_;
      }
      uVar3 = pWVar17[-1].n;
      if ((int)(uint)uVar2 <= (int)uVar3) break;
      if (((int)uVar3 < 1 || !use_copy) ||
         (uVar18 = uVar3 - 1,
         (Regexp *)paVar15[uVar18].submany_ != (Regexp *)paVar15[uVar3].submany_)) {
        _stop = (Regexp *)paVar15[pWVar17[-1].n].submany_;
        local_1a8 = -1;
        local_1a4.begin = pWVar17[-1].pre_arg.begin;
        local_1a4.end.head = pWVar17[-1].pre_arg.end.head;
        local_1a4._8_8_ = *(undefined8 *)&pWVar17[-1].pre_arg.end.tail;
        local_194 = 0;
        local_190.head = 0;
        local_190.tail = 0;
        local_188 = false;
        local_184 = 0;
        local_180.head = 0;
        local_180.tail = 0;
        local_178 = false;
        local_170 = (Frag *)0x0;
        pWVar23 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pWVar23 ==
            (this->stack_).c.
            super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::
          deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
          ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Frag>>
                    ((deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
                      *)this_00,(WalkState<duckdb_re2::Frag> *)&stop);
        }
        else {
          pbVar22 = &stop;
          for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
            pWVar23->re = *(Regexp **)pbVar22;
            pbVar22 = pbVar22 + (ulong)bVar24 * -0x10 + 8;
            pWVar23 = (_Elt_pointer)((long)pWVar23 + (ulong)bVar24 * -0x10 + 8);
          }
          piVar1 = &(this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      else {
        pFVar16 = pWVar17[-1].child_args + uVar18;
        uVar7._0_4_ = pFVar16->begin;
        uVar7._4_4_ = (pFVar16->end).head;
        iVar14 = (*this->_vptr_Walker[4])
                           (this,uVar7,*(undefined8 *)&pWVar17[-1].child_args[uVar18].end.tail);
        pFVar16 = pWVar17[-1].child_args;
        iVar13 = pWVar17[-1].n;
        pFVar16[iVar13].begin = iVar14;
        pFVar16[iVar13].end.head = extraout_var_01;
        pFVar16[iVar13].end.tail = (uint32_t)extraout_RDX_01;
        pFVar16[iVar13].nullable = SUB81((ulong)extraout_RDX_01 >> 0x20,0);
        pWVar17[-1].n = pWVar17[-1].n + 1;
      }
    } while ((int)uVar3 < (int)(uint)uVar2);
    uVar8._0_4_ = pWVar17[-1].parent_arg.begin;
    uVar8._4_4_ = pWVar17[-1].parent_arg.end.head;
    uVar9._0_4_ = pWVar17[-1].pre_arg.begin;
    uVar9._4_4_ = pWVar17[-1].pre_arg.end.head;
    local_1c8 = (*this->_vptr_Walker[3])
                          (this,pRVar5,uVar8,*(undefined8 *)&pWVar17[-1].parent_arg.end.tail,uVar9,
                           *(undefined8 *)&pWVar17[-1].pre_arg.end.tail,pWVar17[-1].child_args,
                           (ulong)(uint)pWVar17[-1].n);
    uStack_1c0 = (uint32_t)extraout_RDX_02;
    uStack_1bc = CONCAT31(uStack_1bc._1_3_,(char)((ulong)extraout_RDX_02 >> 0x20));
    uStack_1c4 = extraout_var_02;
    if ((1 < pRVar5->nsub_) && (pWVar17[-1].child_args != (Frag *)0x0)) {
      operator_delete__(pWVar17[-1].child_args);
    }
LAB_00488763:
    std::
    deque<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
    ::pop_back(&this_00->c);
    pWVar17 = (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar17 !=
        (this->stack_).c.
        super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pWVar17 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar17 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
      }
      if (pWVar17[-1].child_args == (Frag *)0x0) {
        pFVar16 = &pWVar17[-1].child_arg;
      }
      else {
        pFVar16 = pWVar17[-1].child_args + pWVar17[-1].n;
      }
      *(ulong *)((long)&(pFVar16->end).head + 1) =
           CONCAT17((undefined1)uStack_1bc,CONCAT43(uStack_1c0,uStack_1c4._1_3_));
      pFVar16->begin = local_1c8;
      (pFVar16->end).head = uStack_1c4;
      pWVar17[-1].n = pWVar17[-1].n + 1;
      goto LAB_004884bf;
    }
  }
  FVar11.end.head = uStack_1c4;
  FVar11.begin = local_1c8;
  FVar11.end.tail = uStack_1c0;
  FVar11._12_4_ = uStack_1bc;
  return FVar11;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}